

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_open.c
# Opt level: O2

mpt_libhandle * mpt_library_open(char *lib,char *lpath)

{
  void *pvVar1;
  mpt_libhandle *pmVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  size_t __n;
  char *pcVar7;
  char buf [1024];
  
  if (lib == (char *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
  }
  else {
    if ((lpath == (char *)0x0) || (*lib == '/')) {
      pvVar1 = (void *)dlopen(lib,2);
      if (pvVar1 == (void *)0x0) {
        piVar5 = __errno_location();
        *piVar5 = 2;
        return (mpt_libhandle *)0x0;
      }
    }
    else {
      iVar6 = 2;
      do {
        if ((lpath == (char *)0x0) || (*lpath == '\0')) goto LAB_00101a2f;
        pcVar3 = strchr(lpath,0x3a);
        if (pcVar3 == (char *)0x0) {
          __n = strlen(lpath);
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = pcVar3 + 1;
          __n = (long)pcVar3 - (long)lpath;
        }
        if (0x3ff < __n) {
LAB_00101a2c:
          iVar6 = 0x69;
LAB_00101a2f:
          piVar5 = __errno_location();
          *piVar5 = iVar6;
          return (mpt_libhandle *)0x0;
        }
        memcpy(buf,lpath,__n);
        buf[__n] = '/';
        sVar4 = strlen(lib);
        if (0x3ff - __n <= sVar4) goto LAB_00101a2c;
        memcpy(buf + __n + 1,lib,sVar4 + 1);
        pvVar1 = (void *)dlopen(buf,2);
        lpath = pcVar7;
      } while (pvVar1 == (void *)0x0);
    }
    pmVar2 = (mpt_libhandle *)malloc(0x10);
    if (pmVar2 != (mpt_libhandle *)0x0) {
      (pmVar2->_ref)._val = 1;
      pmVar2->addr = pvVar1;
      return pmVar2;
    }
    dlclose(pvVar1);
    dlerror();
    piVar5 = __errno_location();
    *piVar5 = 0xc;
  }
  return (mpt_libhandle *)0x0;
}

Assistant:

extern MPT_STRUCT(libhandle) *mpt_library_open(const char *lib, const char *lpath)
{
	MPT_STRUCT(libhandle) *lh;
	void *newlib;
	
	if (!lib) {
		errno = EINVAL;
		return 0;
	}
	/* no resolution if path absolute */
	if (!lpath || *lib == '/') {
		if (!(newlib = dlopen(lib, RTLD_NOW))) {
			errno = ENOENT;
			return 0;
		}
	}
	else while (1) {
		const char *sep;
		char buf[1024];
		size_t left, len;
		
		if (!lpath || !*lpath) {
			errno = ENOENT;
			return 0;
		}
		if ((sep = strchr(lpath, ':'))) {
			len = sep++ - lpath;
		} else {
			len = strlen(lpath);
		}
		/* set library path */
		if (len >= sizeof(buf)) {
			errno = ENOBUFS;
			return 0;
		}
		left = sizeof(buf) - len;
		memcpy(buf, lpath, len);
		buf[len++] = '/';
		newlib = buf + len;
		
		/* buffer too small */
		if (--left <= (len = strlen(lib))) {
			errno = ENOBUFS;
			return 0;
		}
		memcpy(newlib, lib, len + 1);
		
		if ((newlib = dlopen(buf, RTLD_NOW))) {
			break;
		}
		lpath = sep;
	}
	if (!(lh = malloc(sizeof(*lh)))) {
		dlclose(newlib);
		dlerror();
		errno = ENOMEM;
		return 0;
	}
	lh->_ref._val = 1;
	lh->addr = newlib;
	
	return lh;
}